

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_clock.c
# Opt level: O0

void mk_clock_headers_preset(time_t utime,mk_server *server)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  char *buffer;
  tm result;
  tm *gmt_tm;
  int len2;
  int len1;
  mk_server *server_local;
  time_t utime_local;
  
  server_local = (mk_server *)utime;
  __s = _next_buffer(&server->clock_context->headers_preset,
                     server->clock_context->header_time_buffers);
  result.tm_zone = (char *)gmtime_r((time_t *)&server_local,(tm *)&buffer);
  iVar1 = snprintf(__s,0x40,"%s",server->server_signature_header);
  sVar2 = strftime(__s + iVar1,(long)(0x80 - iVar1),"Date: %a, %d %b %Y %H:%M:%S GMT\r\n",
                   (tm *)result.tm_zone);
  (server->clock_context->headers_preset).data = __s;
  (server->clock_context->headers_preset).len = (long)(iVar1 + (int)sVar2);
  return;
}

Assistant:

static void mk_clock_headers_preset(time_t utime, struct mk_server *server)
{
    int len1;
    int len2;
    struct tm *gmt_tm;
    struct tm result;
    char *buffer;

    buffer = _next_buffer(&server->clock_context->headers_preset,
                          server->clock_context->header_time_buffers);

    gmt_tm = gmtime_r(&utime, &result);

    len1 = snprintf(buffer,
                    HEADER_TIME_BUFFER_SIZE,
                    "%s",
                    server->server_signature_header);

    len2 = strftime(buffer + len1,
                    HEADER_PRESET_SIZE - len1,
                    MK_CLOCK_GMT_DATEFORMAT,
                    gmt_tm);

    server->clock_context->headers_preset.data = buffer;
    server->clock_context->headers_preset.len  = len1 + len2;
}